

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall wabt::SharedValidator::OnBrIf(SharedValidator *this,Location *loc,Var *depth)

{
  Result rhs;
  char *pcVar1;
  int __c;
  Opcode local_2c;
  Var *local_28;
  Var *depth_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  local_28 = depth;
  depth_local = (Var *)loc;
  loc_local = (Location *)this;
  Opcode::Opcode(&local_2c,BrIf);
  pcVar1 = (char *)(ulong)local_2c.enum_;
  this_local._4_4_ = CheckInstr(this,local_2c,&depth_local->loc);
  pcVar1 = Var::index(depth,pcVar1,__c);
  rhs = TypeChecker::OnBrIf(&this->typechecker_,(Index)pcVar1);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnBrIf(const Location& loc, Var depth) {
  Result result = CheckInstr(Opcode::BrIf, loc);
  result |= typechecker_.OnBrIf(depth.index());
  return result;
}